

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O3

void set_roi_cu16_split_cu8(RK_U32 *buf,RK_U32 cu16index,Vepu580RoiH265BsCfg val)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (cu16index & 0x3ffffffc) << 2;
  uVar2 = 0;
  do {
    set_roi_cu8_base_cfg(buf,raster2scan8[uVar1 & 0xfffffff8 | uVar2 & 1 | cu16index * 2 & 6],val);
    uVar2 = uVar2 + 1;
    uVar1 = uVar1 + 4;
  } while (uVar2 != 4);
  return;
}

Assistant:

void set_roi_cu16_split_cu8(RK_U32 *buf, RK_U32 cu16index, Vepu580RoiH265BsCfg val)
{
    RK_S32 cu16_x = cu16index % 4;
    RK_S32 cu16_y = cu16index / 4;
    RK_U32 cu8cnt;

    // mpp_log("cu16index = %d, force intra = %d, cu16_y= %d", cu16index, val.force_intra, cu16_y);
    for (cu8cnt = 0; cu8cnt < 4; cu8cnt++) {
        RK_U32 zindex = 0;
        RK_U32 cu8_x = cu8cnt % 2;
        RK_U32 cu8_y = cu8cnt / 2;
        RK_U32 cu8raster_index = (cu16_y * 2 + cu8_y) * 8 + cu16_x * 2 + cu8_x;

        //  mpp_log("cu8raster_index = %d", cu8raster_index);
        zindex = raster2scan8[cu8raster_index];
        //  mpp_log("cu8raster_index = %d zindex = %d x %d, y %d, cu8_x %d cu8_y %d",
        //          cu8raster_index,zindex, x, y, cu8_x, cu8_y);
        set_roi_cu8_base_cfg(buf, zindex, val);
    }
}